

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O3

void int_trp_warning(int line,char *file,char *format,...)

{
  long *plVar1;
  code *pcVar2;
  long lVar3;
  long *plVar4;
  char *pcVar5;
  char in_AL;
  bool bVar6;
  int iVar7;
  undefined8 in_RCX;
  char *pcVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  char *__s;
  size_t sVar9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_138 [24];
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  va_list values;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  long *local_60 [2];
  long local_50 [2];
  char *local_40;
  int local_34;
  
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  sVar9 = 0x400;
  __s = local_138;
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  local_40 = file;
  local_34 = line;
  do {
    pcVar8 = __s;
    lVar3 = -sVar9;
    __s = pcVar8 + lVar3;
    values[0].overflow_arg_area = local_138;
    values[0]._0_8_ = &stack0x00000008;
    local_88 = 0x3000000018;
    builtin_strncpy(pcVar8 + lVar3 + -8,"I\x1e\x11",4);
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    iVar7 = vsnprintf(__s,sVar9,format,&local_88);
    if (iVar7 < 0) {
      sVar9 = (size_t)((int)sVar9 + 0x400);
    }
    builtin_strncpy(pcVar8 + lVar3 + -8,"_\x1e\x11",4);
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    bVar6 = IsMsgSizeOk((uint32_t)sVar9);
  } while ((iVar7 < 0) && (bVar6));
  builtin_strncpy(pcVar8 + lVar3 + -8,"t\x1e\x11",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  trun::TestRunner::GetCurrentTestModule();
  local_60[0] = local_50;
  __s[-8] = -0x79;
  __s[-7] = '\x1e';
  __s[-6] = '\x11';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  sVar9 = strlen(__s);
  __s[-8] = -0x69;
  __s[-7] = '\x1e';
  __s[-6] = '\x11';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,__s,__s + sVar9);
  iVar7 = local_34;
  pcVar5 = local_40;
  plVar4 = local_60[0];
  plVar1 = *(long **)((long)values[0].reg_save_area + 0x150);
  pcVar2 = *(code **)(*plVar1 + 0x28);
  __s[-8] = -0x47;
  __s[-7] = '\x1e';
  __s[-6] = '\x11';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  (*pcVar2)(plVar1,"%s:%d:%s",pcVar5,iVar7,plVar4);
  plVar1 = local_60[0];
  if (local_60[0] != local_50) {
    __s[-8] = -0x32;
    __s[-7] = '\x1e';
    __s[-6] = '\x11';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    operator_delete(plVar1,local_50[0] + 1);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __s[-8] = -0x24;
    __s[-7] = '\x1e';
    __s[-6] = '\x11';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  return;
}

Assistant:

static void int_trp_warning(int line, const char *file, const char *format, ...) {
    CREATE_REPORT_STRING()
    TestRunner::GetCurrentTestModule()->GetTestResponseProxy().Warning(line, file, std::string(newstr));
}